

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_send_unix(void)

{
  uint __fd;
  int iVar1;
  int extraout_EAX;
  undefined1 *puVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  uv_buf_t buf;
  sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  undefined1 local_2a8 [16];
  sockaddr local_298;
  undefined2 local_288;
  undefined1 uStack_286;
  undefined5 uStack_285;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined6 uStack_240;
  undefined2 uStack_23a;
  undefined6 uStack_238;
  undefined8 uStack_232;
  undefined1 local_228 [216];
  undefined1 local_150 [320];
  
  local_2a8 = uv_buf_init("PING",4);
  puVar2 = (undefined1 *)uv_default_loop();
  uStack_285 = 0;
  uStack_280 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  uStack_240 = 0;
  uStack_23a = 0;
  uStack_238 = 0;
  uStack_232 = 0;
  local_298.sa_family = 1;
  builtin_strncpy(local_298.sa_data,"/tmp/uv-test-s",0xe);
  local_288 = 0x636f;
  uStack_286 = 0x6b;
  puVar4 = (undefined1 *)0x1;
  __fd = socket(1,1,0);
  if ((int)__fd < 0) {
    run_test_udp_send_unix_cold_1();
LAB_0017b695:
    run_test_udp_send_unix_cold_2();
LAB_0017b69a:
    run_test_udp_send_unix_cold_3();
LAB_0017b69f:
    run_test_udp_send_unix_cold_4();
LAB_0017b6a4:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar4 = (undefined1 *)(ulong)__fd;
    iVar1 = bind(__fd,&local_298,0x6e);
    if (iVar1 != 0) goto LAB_0017b695;
    puVar4 = (undefined1 *)(ulong)__fd;
    iVar1 = listen(__fd,1);
    if (iVar1 != 0) goto LAB_0017b69a;
    puVar4 = puVar2;
    iVar1 = uv_udp_init(puVar2,local_228);
    if (iVar1 != 0) goto LAB_0017b69f;
    puVar4 = local_228;
    iVar1 = uv_udp_open(puVar4,__fd);
    if (iVar1 != 0) goto LAB_0017b6a4;
    uv_run(puVar2,0);
    puVar4 = local_150;
    iVar1 = uv_udp_send(puVar4,local_228,local_2a8,1,&local_298,0);
    if (iVar1 == 0) {
      uv_close(local_228,0);
      uv_run(puVar2,0);
      close(__fd);
      unlink("/tmp/uv-test-sock");
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar4 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017b6ae;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_0017b6ae:
  run_test_udp_send_unix_cold_7();
  if (puVar4 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT(strlen(TEST_PIPENAME) < sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(fd >= 0);

  unlink(TEST_PIPENAME);
  ASSERT(0 == bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT(0 == listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT(r == 0);
  r = uv_udp_open(&handle, fd);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY();
  return 0;
}